

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_chain.cpp
# Opt level: O0

void __thiscall Audiostream::Audiostream(Audiostream *this,string *filename)

{
  undefined8 uVar1;
  _func_int **pp_Var2;
  char *in_RSI;
  Element *in_RDI;
  
  Element::Element(in_RDI);
  in_RDI->_vptr_Element = (_func_int **)&PTR__Audiostream_00115b48;
  std::__cxx11::string::string((string *)&in_RDI[1].x);
  in_RDI->w = 0x96;
  Element::set_random_pos(in_RDI);
  basename(in_RSI);
  uVar1 = std::__cxx11::string::c_str();
  pp_Var2 = (_func_int **)al_load_audio_stream(uVar1,4,0x800);
  in_RDI[1]._vptr_Element = pp_Var2;
  if (in_RDI[1]._vptr_Element != (_func_int **)0x0) {
    al_set_audio_stream_playmode(in_RDI[1]._vptr_Element,0x101);
  }
  return;
}

Assistant:

Audiostream::Audiostream(string const& filename)
{
   w = 150;
   set_random_pos();
   basename(filename, this->filename);

   stream = al_load_audio_stream(filename.c_str(), 4, 2048);
   if (stream) {
      al_set_audio_stream_playmode(stream, ALLEGRO_PLAYMODE_LOOP);
   }
}